

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.h
# Opt level: O0

LPUTF8 utf8::EncodeTrueUtf8<false>
                 (char16 ch,char16 **source,charcount_t *cch,LPUTF8 ptr,void *bufferEnd)

{
  char16 surrogateLow_00;
  LPUTF8 retptr;
  char16 surrogateLow;
  char16 surrogateHigh;
  void *bufferEnd_local;
  LPUTF8 ptr_local;
  charcount_t *cch_local;
  char16 **source_local;
  LPUTF8 puStack_10;
  char16 ch_local;
  
  if ((ushort)ch < 0x80) {
    CodexAssertOrFailFast(ptr < bufferEnd);
    *ptr = (utf8char_t)ch;
    puStack_10 = ptr + 1;
  }
  else if (((ushort)ch < 0xd800) || (0xdfff < (ushort)ch)) {
    puStack_10 = EncodeFull<false>(ch,ptr,bufferEnd);
  }
  else if (((*cch == 0) ||
           (((surrogateLow_00 = **source, (ushort)ch < 0xd800 || (0xdbff < (ushort)ch)) ||
            ((ushort)surrogateLow_00 < 0xdc00)))) || (0xdfff < (ushort)surrogateLow_00)) {
    CodexAssertOrFailFast(ptr + 3 <= bufferEnd);
    *ptr = 0xef;
    ptr[1] = 0xbf;
    ptr[2] = 0xbd;
    puStack_10 = ptr + 3;
  }
  else {
    puStack_10 = EncodeSurrogatePair<false>(ch,surrogateLow_00,ptr);
    *source = *source + 1;
    *cch = *cch - 1;
  }
  return puStack_10;
}

Assistant:

inline LPUTF8 EncodeTrueUtf8(char16 ch, const char16** source, charcount_t* cch, _When_(!countBytesOnly, __out_ecount((*cch + 1) * 3)) LPUTF8 ptr, const void * bufferEnd)
    {
        if (ch < 0x80)
        {
            if (!countBytesOnly)
            {
                CodexAssertOrFailFast(ptr < bufferEnd);
                *ptr = static_cast<utf8char_t>(ch);
            }

            return ptr + 1;
        }
        else if (ch < 0xD800 || (ch >= 0xE000 && ch <= 0xFFFF))
        {
            return EncodeFull<countBytesOnly>(ch, ptr, bufferEnd);
        }

        // We're now decoding a surrogate pair. If the input is malformed (eg. low surrogate is absent)
        // we'll instead encode the unicode replacement character as utf8
        if (*cch > 0)
        {
            char16 surrogateHigh = ch;
            char16 surrogateLow = **source;

            // Validate that the surrogate code units are within the appropriate
            // ranges for high and low surrogates
            if ((surrogateHigh >= 0xD800 && surrogateHigh <= 0xDBFF) &&
                (surrogateLow >= 0xDC00 && surrogateLow <= 0xDFFF))
            {
                LPUTF8 retptr = EncodeSurrogatePair<countBytesOnly>(surrogateHigh, surrogateLow, ptr);

                // SAL analysis gets confused if we call EncodeSurrogatePair after
                // modifying cch

                // Consume the low surrogate
                *source = *source + 1;
                *cch = *cch - 1;

                return retptr;
            }
        }

        // Invalid input: insert the unicode replacement character instead
        if (!countBytesOnly)
        {
            CodexAssertOrFailFast(ptr + 3 <= bufferEnd);
            ptr[0] = 0xEF;
            ptr[1] = 0xBF;
            ptr[2] = 0xBD;
        }
        return ptr + 3;
    }